

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

void CheckFinite(MeshGL *mesh)

{
  pointer pfVar1;
  char *in_R9;
  pointer pfVar2;
  AssertHelper AStack_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertionResult gtest_ar_;
  string local_48;
  
  pfVar1 = (mesh->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar2 = (mesh->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = (uint)ABS(*pfVar2) < 0x7f800000;
    if (0x7f7fffff < (uint)ABS(*pfVar2)) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"std::isfinite(v)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                 ,0x124,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
      goto LAB_0012cb93;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  pfVar2 = (mesh->runTransform).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (mesh->runTransform).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pfVar2 == pfVar1) {
      pfVar2 = (mesh->halfedgeTangent).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1 = (mesh->halfedgeTangent).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while( true ) {
        if (pfVar2 == pfVar1) {
          return;
        }
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = (uint)ABS(*pfVar2) < 0x7f800000;
        if (0x7f7fffff < (uint)ABS(*pfVar2)) break;
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        pfVar2 = pfVar2 + 1;
      }
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"std::isfinite(v)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                 ,0x12a,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
LAB_0012cb93:
      testing::internal::AssertHelper::~AssertHelper(&AStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      return;
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = (uint)ABS(*pfVar2) < 0x7f800000;
    if (0x7f7fffff < (uint)ABS(*pfVar2)) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"std::isfinite(v)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                 ,0x127,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
      goto LAB_0012cb93;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pfVar2 = pfVar2 + 1;
  } while( true );
}

Assistant:

void CheckFinite(const MeshGL& mesh) {
  for (float v : mesh.vertProperties) {
    ASSERT_TRUE(std::isfinite(v));
  }
  for (float v : mesh.runTransform) {
    ASSERT_TRUE(std::isfinite(v));
  }
  for (float v : mesh.halfedgeTangent) {
    ASSERT_TRUE(std::isfinite(v));
  }
}